

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<QList<QGraphicsItem_*>_> * __thiscall
QList<QList<QGraphicsItem_*>_>::fill
          (QList<QList<QGraphicsItem_*>_> *this,parameter_type t,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QGenericArrayOps<QList<QGraphicsItem_*>_> *pQVar3;
  char *in_RDX;
  __off_t __length;
  QArrayDataPointer<QList<QGraphicsItem_*>_> *in_RDI;
  long in_FS_OFFSET;
  QList<QGraphicsItem_*> copy;
  DataPointer detached;
  QArrayDataPointer<QList<QGraphicsItem_*>_> *in_stack_ffffffffffffff58;
  QArrayDataPointer<QList<QGraphicsItem_*>_> *in_stack_ffffffffffffff60;
  char *pcVar4;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffff68;
  QArrayDataPointer<QList<QGraphicsItem_*>_> *in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<QList<QGraphicsItem_*>_> *in_stack_ffffffffffffff80;
  qsizetype local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QArrayDataPointer<QList<QGraphicsItem_*>_> local_28;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RDX;
  if (in_RDX == (char *)0xffffffffffffffff) {
    local_10 = (char *)size((QList<QList<QGraphicsItem_*>_> *)in_RDI);
  }
  QArrayDataPointer<QList<QGraphicsItem_*>_>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QList<QGraphicsItem_*>_>::needsDetach(in_stack_ffffffffffffff60);
  pcVar4 = local_10;
  if ((bVar1) ||
     (qVar2 = capacity((QList<QList<QGraphicsItem_*>_> *)0xa1a092), qVar2 < (long)pcVar4)) {
    local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (QList<QGraphicsItem_*> *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QList<QGraphicsItem_*>_>::operator->(in_RDI);
    QArrayDataPointer<QList<QGraphicsItem_*>_>::detachCapacity
              (in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68);
    QArrayDataPointer<QList<QGraphicsItem_*>_>::QArrayDataPointer
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,
               (AllocationOption)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    QArrayDataPointer<QList<QGraphicsItem_*>_>::operator->(&local_28);
    QtPrivate::QGenericArrayOps<QList<QGraphicsItem_*>_>::copyAppend
              ((QGenericArrayOps<QList<QGraphicsItem_*>_> *)in_stack_ffffffffffffff70,
               (qsizetype)in_stack_ffffffffffffff68,(parameter_type)in_stack_ffffffffffffff60);
    QArrayDataPointer<QList<QGraphicsItem_*>_>::swap
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    QArrayDataPointer<QList<QGraphicsItem_*>_>::~QArrayDataPointer(in_stack_ffffffffffffff60);
  }
  else {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QGraphicsItem_*>::QList
              ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff60,
               (QList<QGraphicsItem_*> *)in_stack_ffffffffffffff58);
    QArrayDataPointer<QList<QGraphicsItem_*>_>::operator->(in_RDI);
    QArrayDataPointer<QList<QGraphicsItem_*>_>::begin
              ((QArrayDataPointer<QList<QGraphicsItem_*>_> *)0xa1a195);
    QArrayDataPointer<QList<QGraphicsItem_*>_>::begin
              ((QArrayDataPointer<QList<QGraphicsItem_*>_> *)0xa1a1a4);
    local_48 = size((QList<QList<QGraphicsItem_*>_> *)in_RDI);
    qMin<long_long>(&local_48,(longlong *)&local_10);
    QtPrivate::QGenericArrayOps<QList<QGraphicsItem_*>_>::assign
              ((QGenericArrayOps<QList<QGraphicsItem_*>_> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68,(QList<QGraphicsItem_*> *)in_stack_ffffffffffffff60,
               (parameter_type)in_stack_ffffffffffffff58);
    pcVar4 = local_10;
    qVar2 = size((QList<QList<QGraphicsItem_*>_> *)in_RDI);
    if (qVar2 < (long)pcVar4) {
      pQVar3 = (QGenericArrayOps<QList<QGraphicsItem_*>_> *)
               QArrayDataPointer<QList<QGraphicsItem_*>_>::operator->(in_RDI);
      pcVar4 = local_10;
      size((QList<QList<QGraphicsItem_*>_> *)in_RDI);
      QtPrivate::QGenericArrayOps<QList<QGraphicsItem_*>_>::copyAppend
                (pQVar3,(qsizetype)pcVar4,(parameter_type)in_stack_ffffffffffffff60);
    }
    else {
      pcVar4 = local_10;
      qVar2 = size((QList<QList<QGraphicsItem_*>_> *)in_RDI);
      if ((long)pcVar4 < qVar2) {
        pQVar3 = (QGenericArrayOps<QList<QGraphicsItem_*>_> *)
                 QArrayDataPointer<QList<QGraphicsItem_*>_>::operator->(in_RDI);
        QtPrivate::QGenericArrayOps<QList<QGraphicsItem_*>_>::truncate(pQVar3,local_10,__length);
      }
    }
    QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0xa1a297);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QList<QGraphicsItem_*>_> *)in_RDI;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}